

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall libcellml::Parser::~Parser(Parser *this)

{
  pointer puVar1;
  LoggerImpl *pLVar2;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__Parser_002e8130;
  (this->super_Strict)._vptr_Strict = (_func_int **)&DAT_002e8150;
  pLVar2 = Logger::pFunc(&this->super_Logger);
  if (pLVar2 != (LoggerImpl *)0x0) {
    std::
    vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>::
    ~vector(&pLVar2->mIssues);
    puVar1 = (pLVar2->mMessages).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(pLVar2->mMessages).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    puVar1 = (pLVar2->mWarnings).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(pLVar2->mWarnings).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    puVar1 = (pLVar2->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(pLVar2->mErrors).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
  }
  operator_delete(pLVar2,0x70);
  Strict::~Strict(&this->super_Strict);
  Logger::~Logger(&this->super_Logger);
  return;
}

Assistant:

Parser::~Parser()
{
    delete pFunc();
}